

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

void __thiscall RtApiAlsa::callbackEvent(RtApiAlsa *this)

{
  undefined8 uVar1;
  char *pcVar2;
  _func_int *p_Var3;
  long lVar4;
  RtApi *pRVar5;
  RtApiAlsa *pRVar6;
  int iVar7;
  RtAudioFormat RVar8;
  char *pcVar9;
  ostream *poVar10;
  long lVar11;
  uint uVar12;
  ostream **ppoVar13;
  undefined8 extraout_XMM0_Qa;
  undefined8 uStack_1d0;
  ostream *local_1c8;
  ostream *local_1c0;
  ostream *local_1b8;
  ostream *local_1b0;
  long local_1a8;
  uint local_19c;
  ostream *local_198;
  ostream *local_190;
  ostream *local_188;
  ostream *local_180;
  long local_178;
  uint local_16c;
  RtApiAlsa *local_168;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  int local_100;
  int local_fc;
  snd_pcm_state_t state_1;
  int i_1;
  size_t offset_1;
  unsigned_long __vla_expr1;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  int local_80;
  int local_7c;
  snd_pcm_state_t state;
  int i;
  size_t offset;
  unsigned_long __vla_expr0;
  RtAudioFormat local_60;
  RtAudioFormat format;
  snd_pcm_sframes_t frames;
  snd_pcm_t **handle;
  char *pcStack_40;
  int channels;
  char *buffer;
  int result;
  RtAudioStreamStatus status;
  double streamTime;
  RtAudioCallback callback;
  void *pvStack_18;
  int doStopStream;
  AlsaHandle *apiInfo;
  RtApiAlsa *this_local;
  
  ppoVar13 = &local_1c8;
  pvStack_18 = (this->super_RtApi).stream_.apiHandle;
  local_168 = this;
  apiInfo = (AlsaHandle *)this;
  if ((this->super_RtApi).stream_.state == STREAM_STOPPED) {
    uStack_1d0 = 0x122eec;
    pthread_mutex_lock((pthread_mutex_t *)&(this->super_RtApi).stream_.mutex);
    while (((*(byte *)((long)pvStack_18 + 0x48) ^ 0xff) & 1) != 0) {
      uStack_1d0 = 0x122f1d;
      pthread_cond_wait((pthread_cond_t *)((long)pvStack_18 + 0x18),
                        (pthread_mutex_t *)&(local_168->super_RtApi).stream_.mutex);
    }
    if ((local_168->super_RtApi).stream_.state != STREAM_RUNNING) {
      uStack_1d0 = 0x122f49;
      pthread_mutex_unlock((pthread_mutex_t *)&(local_168->super_RtApi).stream_.mutex);
      return;
    }
    uStack_1d0 = 0x122f68;
    pthread_mutex_unlock((pthread_mutex_t *)&(local_168->super_RtApi).stream_.mutex);
  }
  if ((local_168->super_RtApi).stream_.state == STREAM_CLOSED) {
    uStack_1d0 = 0x122f92;
    std::__cxx11::string::operator=
              ((string *)&(local_168->super_RtApi).errorText_,
               "RtApiAlsa::callbackEvent(): the stream is closed ... this shouldn\'t happen!");
    uStack_1d0 = 0x122fa3;
    RtApi::error(&local_168->super_RtApi,RTAUDIO_WARNING);
  }
  else {
    callback._4_4_ = 0;
    streamTime = (double)(local_168->super_RtApi).stream_.callbackInfo.callback;
    uStack_1d0 = 0x122fc7;
    (*(local_168->super_RtApi)._vptr_RtApi[9])();
    buffer._4_4_ = 0;
    if (((local_168->super_RtApi).stream_.mode != INPUT) &&
       ((*(byte *)((long)pvStack_18 + 0x11) & 1) == 1)) {
      buffer._4_4_ = 2;
      *(undefined1 *)((long)pvStack_18 + 0x11) = 0;
    }
    if (((local_168->super_RtApi).stream_.mode != OUTPUT) &&
       ((*(byte *)((long)pvStack_18 + 0x12) & 1) == 1)) {
      buffer._4_4_ = buffer._4_4_ | 1;
      *(undefined1 *)((long)pvStack_18 + 0x12) = 0;
    }
    uStack_1d0 = 0x123068;
    callback._4_4_ =
         (*(code *)streamTime)
                   (extraout_XMM0_Qa,(local_168->super_RtApi).stream_.userBuffer[0],
                    (local_168->super_RtApi).stream_.userBuffer[1],
                    (local_168->super_RtApi).stream_.bufferSize,buffer._4_4_,
                    (local_168->super_RtApi).stream_.callbackInfo.userData);
    if (callback._4_4_ == 2) {
      uStack_1d0 = 0x12307e;
      (*(local_168->super_RtApi)._vptr_RtApi[8])();
    }
    else {
      uStack_1d0 = 0x12309d;
      pthread_mutex_lock((pthread_mutex_t *)&(local_168->super_RtApi).stream_.mutex);
      pRVar6 = local_168;
      if ((local_168->super_RtApi).stream_.state != STREAM_STOPPED) {
        frames = (snd_pcm_sframes_t)pvStack_18;
        if (((local_168->super_RtApi).stream_.mode == INPUT) ||
           (ppoVar13 = &local_1c8, (local_168->super_RtApi).stream_.mode == DUPLEX)) {
          if (((local_168->super_RtApi).stream_.doConvertBuffer[1] & 1U) == 0) {
            pcStack_40 = (local_168->super_RtApi).stream_.userBuffer[1];
            handle._4_4_ = (local_168->super_RtApi).stream_.nUserChannels[1];
            local_60 = (local_168->super_RtApi).stream_.userFormat;
          }
          else {
            pcStack_40 = (local_168->super_RtApi).stream_.deviceBuffer;
            handle._4_4_ = (local_168->super_RtApi).stream_.nDeviceChannels[1];
            local_60 = (local_168->super_RtApi).stream_.deviceFormat[1];
          }
          RVar8 = local_60;
          if (((local_168->super_RtApi).stream_.deviceInterleaved[1] & 1U) == 0) {
            offset = (size_t)handle._4_4_;
            lVar4 = -(offset * 8 + 0xf & 0xfffffffffffffff0);
            local_178 = (long)&local_1c8 + lVar4;
            local_16c = (local_168->super_RtApi).stream_.bufferSize;
            __vla_expr0 = (unsigned_long)&local_1c8;
            *(undefined8 *)((long)&uStack_1d0 + lVar4) = 0x1231ba;
            uVar12 = RtApi::formatBytes(&pRVar6->super_RtApi,RVar8);
            lVar11 = local_178;
            _state = (ulong)(local_16c * uVar12);
            for (local_7c = 0; local_7c < (int)handle._4_4_; local_7c = local_7c + 1) {
              *(char **)(local_178 + (long)local_7c * 8) = pcStack_40 + (long)local_7c * _state;
            }
            uVar1 = *(undefined8 *)(frames + 8);
            uVar12 = (local_168->super_RtApi).stream_.bufferSize;
            *(undefined8 *)((long)&uStack_1d0 + lVar4) = 0x123227;
            buffer._0_4_ = snd_pcm_readn(uVar1,lVar11,uVar12);
            ppoVar13 = (ostream **)__vla_expr0;
          }
          else {
            uStack_1d0 = 0x12316c;
            buffer._0_4_ = snd_pcm_readi(*(undefined8 *)((long)pvStack_18 + 8),pcStack_40,
                                         (local_168->super_RtApi).stream_.bufferSize);
            ppoVar13 = &local_1c8;
          }
          pcVar9 = pcStack_40;
          RVar8 = local_60;
          pRVar6 = local_168;
          if ((int)buffer < (int)(local_168->super_RtApi).stream_.bufferSize) {
            if ((int)buffer == -0x20) {
              uVar1 = *(undefined8 *)(frames + 8);
              *(undefined8 *)((long)ppoVar13 + -8) = 0x12325e;
              local_80 = snd_pcm_state(uVar1);
              if (local_80 == 4) {
                *(undefined1 *)((long)pvStack_18 + 0x12) = 1;
                uVar1 = *(undefined8 *)(frames + 8);
                *(undefined8 *)((long)ppoVar13 + -8) = 0x123280;
                buffer._0_4_ = snd_pcm_prepare(uVar1);
                if ((int)buffer < 0) {
                  pRVar5 = &local_168->super_RtApi;
                  *(undefined8 *)((long)ppoVar13 + -8) = 0x1232a4;
                  local_180 = std::operator<<((ostream *)&pRVar5->errorStream_,
                                              "RtApiAlsa::callbackEvent: error preparing device after overrun, "
                                             );
                  iVar7 = (int)buffer;
                  *(undefined8 *)((long)ppoVar13 + -8) = 0x1232b3;
                  pcVar9 = (char *)snd_strerror(iVar7);
                  poVar10 = local_180;
                  *(undefined8 *)((long)ppoVar13 + -8) = 0x1232c2;
                  poVar10 = std::operator<<(poVar10,pcVar9);
                  *(undefined8 *)((long)ppoVar13 + -8) = 0x1232d1;
                  std::operator<<(poVar10,".");
                  *(undefined8 *)((long)ppoVar13 + -8) = 0x1232e8;
                  std::__cxx11::ostringstream::str();
                  pRVar5 = &local_168->super_RtApi;
                  *(undefined8 *)((long)ppoVar13 + -8) = 0x123302;
                  std::__cxx11::string::operator=((string *)&pRVar5->errorText_,local_a0);
                  *(undefined8 *)((long)ppoVar13 + -8) = 0x12330e;
                  std::__cxx11::string::~string(local_a0);
                }
              }
              else {
                pRVar5 = &local_168->super_RtApi;
                *(undefined8 *)((long)ppoVar13 + -8) = 0x12332a;
                local_190 = std::operator<<((ostream *)&pRVar5->errorStream_,
                                            "RtApiAlsa::callbackEvent: error, current state is ");
                iVar7 = local_80;
                *(undefined8 *)((long)ppoVar13 + -8) = 0x123339;
                pcVar9 = (char *)snd_pcm_state_name(iVar7);
                poVar10 = local_190;
                *(undefined8 *)((long)ppoVar13 + -8) = 0x123348;
                poVar10 = std::operator<<(poVar10,pcVar9);
                *(undefined8 *)((long)ppoVar13 + -8) = 0x123357;
                local_188 = std::operator<<(poVar10,", ");
                iVar7 = (int)buffer;
                *(undefined8 *)((long)ppoVar13 + -8) = 0x123366;
                pcVar9 = (char *)snd_strerror(iVar7);
                poVar10 = local_188;
                *(undefined8 *)((long)ppoVar13 + -8) = 0x123375;
                poVar10 = std::operator<<(poVar10,pcVar9);
                *(undefined8 *)((long)ppoVar13 + -8) = 0x123384;
                std::operator<<(poVar10,".");
                *(undefined8 *)((long)ppoVar13 + -8) = 0x12339b;
                std::__cxx11::ostringstream::str();
                pRVar5 = &local_168->super_RtApi;
                *(undefined8 *)((long)ppoVar13 + -8) = 0x1233b5;
                std::__cxx11::string::operator=((string *)&pRVar5->errorText_,local_c0);
                *(undefined8 *)((long)ppoVar13 + -8) = 0x1233c1;
                std::__cxx11::string::~string(local_c0);
              }
            }
            else {
              pRVar5 = &local_168->super_RtApi;
              *(undefined8 *)((long)ppoVar13 + -8) = 0x1233dd;
              local_198 = std::operator<<((ostream *)&pRVar5->errorStream_,
                                          "RtApiAlsa::callbackEvent: audio read error, ");
              iVar7 = (int)buffer;
              *(undefined8 *)((long)ppoVar13 + -8) = 0x1233ec;
              pcVar9 = (char *)snd_strerror(iVar7);
              poVar10 = local_198;
              *(undefined8 *)((long)ppoVar13 + -8) = 0x1233fb;
              poVar10 = std::operator<<(poVar10,pcVar9);
              *(undefined8 *)((long)ppoVar13 + -8) = 0x12340a;
              std::operator<<(poVar10,".");
              *(undefined8 *)((long)ppoVar13 + -8) = 0x123421;
              std::__cxx11::ostringstream::str();
              pRVar5 = &local_168->super_RtApi;
              *(undefined8 *)((long)ppoVar13 + -8) = 0x12343b;
              std::__cxx11::string::operator=((string *)&pRVar5->errorText_,local_e0);
              *(undefined8 *)((long)ppoVar13 + -8) = 0x123447;
              std::__cxx11::string::~string(local_e0);
            }
            pRVar6 = local_168;
            *(undefined8 *)((long)ppoVar13 + -8) = 0x123458;
            RtApi::error(&pRVar6->super_RtApi,RTAUDIO_WARNING);
          }
          else {
            if (((local_168->super_RtApi).stream_.doByteSwap[1] & 1U) != 0) {
              uVar12 = (local_168->super_RtApi).stream_.bufferSize * handle._4_4_;
              *(undefined8 *)((long)ppoVar13 + -8) = 0x12348b;
              RtApi::byteSwapBuffer(&pRVar6->super_RtApi,pcVar9,uVar12,RVar8);
            }
            pRVar6 = local_168;
            if (((local_168->super_RtApi).stream_.doConvertBuffer[1] & 1U) != 0) {
              pcVar9 = (local_168->super_RtApi).stream_.userBuffer[1];
              pcVar2 = (local_168->super_RtApi).stream_.deviceBuffer;
              pRVar5 = &local_168->super_RtApi;
              *(undefined8 *)((long)ppoVar13 + -8) = 0x1234ca;
              RtApi::convertBuffer
                        (&pRVar6->super_RtApi,pcVar9,pcVar2,(pRVar5->stream_).convertInfo + 1);
            }
            uVar1 = *(undefined8 *)(frames + 8);
            *(undefined8 *)((long)ppoVar13 + -8) = 0x1234db;
            buffer._0_4_ = snd_pcm_delay(uVar1,&format);
            if (((int)buffer == 0) && (0 < (long)format)) {
              (local_168->super_RtApi).stream_.latency[1] = format;
            }
          }
        }
        pRVar6 = local_168;
        if (((local_168->super_RtApi).stream_.mode == OUTPUT) ||
           ((local_168->super_RtApi).stream_.mode == DUPLEX)) {
          if (((local_168->super_RtApi).stream_.doConvertBuffer[0] & 1U) == 0) {
            pcStack_40 = (local_168->super_RtApi).stream_.userBuffer[0];
            handle._4_4_ = (local_168->super_RtApi).stream_.nUserChannels[0];
            local_60 = (local_168->super_RtApi).stream_.userFormat;
          }
          else {
            pcVar9 = (local_168->super_RtApi).stream_.deviceBuffer;
            pcVar2 = (local_168->super_RtApi).stream_.userBuffer[0];
            pRVar5 = &local_168->super_RtApi;
            pcStack_40 = pcVar9;
            *(undefined8 *)((long)ppoVar13 + -8) = 0x123568;
            RtApi::convertBuffer(&pRVar6->super_RtApi,pcVar9,pcVar2,(pRVar5->stream_).convertInfo);
            handle._4_4_ = (local_168->super_RtApi).stream_.nDeviceChannels[0];
            local_60 = (local_168->super_RtApi).stream_.deviceFormat[0];
          }
          pcVar9 = pcStack_40;
          RVar8 = local_60;
          pRVar6 = local_168;
          if (((local_168->super_RtApi).stream_.doByteSwap[0] & 1U) != 0) {
            uVar12 = (local_168->super_RtApi).stream_.bufferSize * handle._4_4_;
            *(undefined8 *)((long)ppoVar13 + -8) = 0x1235d9;
            RtApi::byteSwapBuffer(&pRVar6->super_RtApi,pcVar9,uVar12,RVar8);
          }
          pcVar9 = pcStack_40;
          RVar8 = local_60;
          pRVar6 = local_168;
          if (((local_168->super_RtApi).stream_.deviceInterleaved[0] & 1U) == 0) {
            offset_1 = (size_t)handle._4_4_;
            lVar11 = (long)ppoVar13 - (offset_1 * 8 + 0xf & 0xfffffffffffffff0);
            local_19c = (local_168->super_RtApi).stream_.bufferSize;
            local_1a8 = lVar11;
            __vla_expr1 = (unsigned_long)ppoVar13;
            *(undefined8 *)(lVar11 + -8) = 0x12365c;
            uVar12 = RtApi::formatBytes(&pRVar6->super_RtApi,RVar8);
            lVar4 = local_1a8;
            _state_1 = (ulong)(local_19c * uVar12);
            for (local_fc = 0; local_fc < (int)handle._4_4_; local_fc = local_fc + 1) {
              *(char **)(local_1a8 + (long)local_fc * 8) = pcStack_40 + (long)local_fc * _state_1;
            }
            uVar1 = *(undefined8 *)frames;
            uVar12 = (local_168->super_RtApi).stream_.bufferSize;
            *(undefined8 *)(lVar11 + -8) = 0x1236e0;
            buffer._0_4_ = snd_pcm_writen(uVar1,lVar4,uVar12);
            ppoVar13 = (ostream **)__vla_expr1;
          }
          else {
            uVar1 = *(undefined8 *)frames;
            uVar12 = (local_168->super_RtApi).stream_.bufferSize;
            *(undefined8 *)((long)ppoVar13 + -8) = 0x123608;
            buffer._0_4_ = snd_pcm_writei(uVar1,pcVar9,uVar12);
          }
          if ((int)buffer < (int)(local_168->super_RtApi).stream_.bufferSize) {
            if ((int)buffer == -0x20) {
              uVar1 = *(undefined8 *)frames;
              *(undefined8 *)((long)ppoVar13 + -8) = 0x123719;
              local_100 = snd_pcm_state(uVar1);
              if (local_100 == 4) {
                *(undefined1 *)((long)pvStack_18 + 0x11) = 1;
                uVar1 = *(undefined8 *)frames;
                *(undefined8 *)((long)ppoVar13 + -8) = 0x123740;
                buffer._0_4_ = snd_pcm_prepare(uVar1);
                if ((int)buffer < 0) {
                  pRVar5 = &local_168->super_RtApi;
                  *(undefined8 *)((long)ppoVar13 + -8) = 0x123764;
                  local_1b0 = std::operator<<((ostream *)&pRVar5->errorStream_,
                                              "RtApiAlsa::callbackEvent: error preparing device after underrun, "
                                             );
                  iVar7 = (int)buffer;
                  *(undefined8 *)((long)ppoVar13 + -8) = 0x123773;
                  pcVar9 = (char *)snd_strerror(iVar7);
                  poVar10 = local_1b0;
                  *(undefined8 *)((long)ppoVar13 + -8) = 0x123782;
                  poVar10 = std::operator<<(poVar10,pcVar9);
                  *(undefined8 *)((long)ppoVar13 + -8) = 0x123791;
                  std::operator<<(poVar10,".");
                  *(undefined8 *)((long)ppoVar13 + -8) = 0x1237a8;
                  std::__cxx11::ostringstream::str();
                  pRVar5 = &local_168->super_RtApi;
                  *(undefined8 *)((long)ppoVar13 + -8) = 0x1237c2;
                  std::__cxx11::string::operator=((string *)&pRVar5->errorText_,local_120);
                  *(undefined8 *)((long)ppoVar13 + -8) = 0x1237ce;
                  std::__cxx11::string::~string(local_120);
                }
                else {
                  pRVar5 = &local_168->super_RtApi;
                  *(undefined8 *)((long)ppoVar13 + -8) = 0x1237ea;
                  std::__cxx11::string::operator=
                            ((string *)&pRVar5->errorText_,
                             "RtApiAlsa::callbackEvent: audio write error, underrun.");
                }
              }
              else {
                pRVar5 = &local_168->super_RtApi;
                *(undefined8 *)((long)ppoVar13 + -8) = 0x123806;
                local_1c0 = std::operator<<((ostream *)&pRVar5->errorStream_,
                                            "RtApiAlsa::callbackEvent: error, current state is ");
                iVar7 = local_100;
                *(undefined8 *)((long)ppoVar13 + -8) = 0x123818;
                pcVar9 = (char *)snd_pcm_state_name(iVar7);
                poVar10 = local_1c0;
                *(undefined8 *)((long)ppoVar13 + -8) = 0x123827;
                poVar10 = std::operator<<(poVar10,pcVar9);
                *(undefined8 *)((long)ppoVar13 + -8) = 0x123836;
                local_1b8 = std::operator<<(poVar10,", ");
                iVar7 = (int)buffer;
                *(undefined8 *)((long)ppoVar13 + -8) = 0x123845;
                pcVar9 = (char *)snd_strerror(iVar7);
                poVar10 = local_1b8;
                *(undefined8 *)((long)ppoVar13 + -8) = 0x123854;
                poVar10 = std::operator<<(poVar10,pcVar9);
                *(undefined8 *)((long)ppoVar13 + -8) = 0x123863;
                std::operator<<(poVar10,".");
                *(undefined8 *)((long)ppoVar13 + -8) = 0x12387a;
                std::__cxx11::ostringstream::str();
                pRVar5 = &local_168->super_RtApi;
                *(undefined8 *)((long)ppoVar13 + -8) = 0x123894;
                std::__cxx11::string::operator=((string *)&pRVar5->errorText_,local_140);
                *(undefined8 *)((long)ppoVar13 + -8) = 0x1238a0;
                std::__cxx11::string::~string(local_140);
              }
            }
            else {
              pRVar5 = &local_168->super_RtApi;
              *(undefined8 *)((long)ppoVar13 + -8) = 0x1238bc;
              local_1c8 = std::operator<<((ostream *)&pRVar5->errorStream_,
                                          "RtApiAlsa::callbackEvent: audio write error, ");
              iVar7 = (int)buffer;
              *(undefined8 *)((long)ppoVar13 + -8) = 0x1238cb;
              pcVar9 = (char *)snd_strerror(iVar7);
              poVar10 = local_1c8;
              *(undefined8 *)((long)ppoVar13 + -8) = 0x1238da;
              poVar10 = std::operator<<(poVar10,pcVar9);
              *(undefined8 *)((long)ppoVar13 + -8) = 0x1238e9;
              std::operator<<(poVar10,".");
              *(undefined8 *)((long)ppoVar13 + -8) = 0x123900;
              std::__cxx11::ostringstream::str();
              pRVar5 = &local_168->super_RtApi;
              *(undefined8 *)((long)ppoVar13 + -8) = 0x12391a;
              std::__cxx11::string::operator=((string *)&pRVar5->errorText_,local_160);
              *(undefined8 *)((long)ppoVar13 + -8) = 0x123926;
              std::__cxx11::string::~string(local_160);
            }
            pRVar6 = local_168;
            *(undefined8 *)((long)ppoVar13 + -8) = 0x123937;
            RtApi::error(&pRVar6->super_RtApi,RTAUDIO_WARNING);
          }
          else {
            uVar1 = *(undefined8 *)frames;
            *(undefined8 *)((long)ppoVar13 + -8) = 0x123949;
            buffer._0_4_ = snd_pcm_delay(uVar1,&format);
            if (((int)buffer == 0) && (0 < (long)format)) {
              (local_168->super_RtApi).stream_.latency[0] = format;
            }
          }
        }
      }
      pRVar5 = &local_168->super_RtApi;
      *(undefined8 *)((long)ppoVar13 + -8) = 0x123989;
      pthread_mutex_unlock((pthread_mutex_t *)&(pRVar5->stream_).mutex);
      pRVar6 = local_168;
      *(undefined8 *)((long)ppoVar13 + -8) = 0x123995;
      RtApi::tickStreamTime(&pRVar6->super_RtApi);
      if (callback._4_4_ == 1) {
        p_Var3 = (local_168->super_RtApi)._vptr_RtApi[7];
        *(undefined8 *)((long)ppoVar13 + -8) = 0x1239a8;
        (*p_Var3)();
      }
    }
  }
  return;
}

Assistant:

void RtApiAlsa :: callbackEvent()
{
  AlsaHandle *apiInfo = (AlsaHandle *) stream_.apiHandle;
  if ( stream_.state == STREAM_STOPPED ) {
    MUTEX_LOCK( &stream_.mutex );
    while ( !apiInfo->runnable )
      pthread_cond_wait( &apiInfo->runnable_cv, &stream_.mutex );

    if ( stream_.state != STREAM_RUNNING ) {
      MUTEX_UNLOCK( &stream_.mutex );
      return;
    }
    MUTEX_UNLOCK( &stream_.mutex );
  }

  if ( stream_.state == STREAM_CLOSED ) {
    errorText_ = "RtApiAlsa::callbackEvent(): the stream is closed ... this shouldn't happen!";
    error( RTAUDIO_WARNING );
    return;
  }

  int doStopStream = 0;
  RtAudioCallback callback = (RtAudioCallback) stream_.callbackInfo.callback;
  double streamTime = getStreamTime();
  RtAudioStreamStatus status = 0;
  if ( stream_.mode != INPUT && apiInfo->xrun[0] == true ) {
    status |= RTAUDIO_OUTPUT_UNDERFLOW;
    apiInfo->xrun[0] = false;
  }
  if ( stream_.mode != OUTPUT && apiInfo->xrun[1] == true ) {
    status |= RTAUDIO_INPUT_OVERFLOW;
    apiInfo->xrun[1] = false;
  }
  doStopStream = callback( stream_.userBuffer[0], stream_.userBuffer[1],
                           stream_.bufferSize, streamTime, status, stream_.callbackInfo.userData );

  if ( doStopStream == 2 ) {
    abortStream();
    return;
  }

  MUTEX_LOCK( &stream_.mutex );

  // The state might change while waiting on a mutex.
  if ( stream_.state == STREAM_STOPPED ) goto unlock;

  int result;
  char *buffer;
  int channels;
  snd_pcm_t **handle;
  snd_pcm_sframes_t frames;
  RtAudioFormat format;
  handle = (snd_pcm_t **) apiInfo->handles;

  if ( stream_.mode == INPUT || stream_.mode == DUPLEX ) {

    // Setup parameters.
    if ( stream_.doConvertBuffer[1] ) {
      buffer = stream_.deviceBuffer;
      channels = stream_.nDeviceChannels[1];
      format = stream_.deviceFormat[1];
    }
    else {
      buffer = stream_.userBuffer[1];
      channels = stream_.nUserChannels[1];
      format = stream_.userFormat;
    }

    // Read samples from device in interleaved/non-interleaved format.
    if ( stream_.deviceInterleaved[1] )
      result = snd_pcm_readi( handle[1], buffer, stream_.bufferSize );
    else {
      void *bufs[channels];
      size_t offset = stream_.bufferSize * formatBytes( format );
      for ( int i=0; i<channels; i++ )
        bufs[i] = (void *) (buffer + (i * offset));
      result = snd_pcm_readn( handle[1], bufs, stream_.bufferSize );
    }

    if ( result < (int) stream_.bufferSize ) {
      // Either an error or overrun occurred.
      if ( result == -EPIPE ) {
        snd_pcm_state_t state = snd_pcm_state( handle[1] );
        if ( state == SND_PCM_STATE_XRUN ) {
          apiInfo->xrun[1] = true;
          result = snd_pcm_prepare( handle[1] );
          if ( result < 0 ) {
            errorStream_ << "RtApiAlsa::callbackEvent: error preparing device after overrun, " << snd_strerror( result ) << ".";
            errorText_ = errorStream_.str();
          }
        }
        else {
          errorStream_ << "RtApiAlsa::callbackEvent: error, current state is " << snd_pcm_state_name( state ) << ", " << snd_strerror( result ) << ".";
          errorText_ = errorStream_.str();
        }
      }
      else {
        errorStream_ << "RtApiAlsa::callbackEvent: audio read error, " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
      }
      error( RTAUDIO_WARNING );
      goto tryOutput;
    }

    // Do byte swapping if necessary.
    if ( stream_.doByteSwap[1] )
      byteSwapBuffer( buffer, stream_.bufferSize * channels, format );

    // Do buffer conversion if necessary.
    if ( stream_.doConvertBuffer[1] )
      convertBuffer( stream_.userBuffer[1], stream_.deviceBuffer, stream_.convertInfo[1] );

    // Check stream latency
    result = snd_pcm_delay( handle[1], &frames );
    if ( result == 0 && frames > 0 ) stream_.latency[1] = frames;
  }

 tryOutput:

  if ( stream_.mode == OUTPUT || stream_.mode == DUPLEX ) {

    // Setup parameters and do buffer conversion if necessary.
    if ( stream_.doConvertBuffer[0] ) {
      buffer = stream_.deviceBuffer;
      convertBuffer( buffer, stream_.userBuffer[0], stream_.convertInfo[0] );
      channels = stream_.nDeviceChannels[0];
      format = stream_.deviceFormat[0];
    }
    else {
      buffer = stream_.userBuffer[0];
      channels = stream_.nUserChannels[0];
      format = stream_.userFormat;
    }

    // Do byte swapping if necessary.
    if ( stream_.doByteSwap[0] )
      byteSwapBuffer(buffer, stream_.bufferSize * channels, format);

    // Write samples to device in interleaved/non-interleaved format.
    if ( stream_.deviceInterleaved[0] )
      result = snd_pcm_writei( handle[0], buffer, stream_.bufferSize );
    else {
      void *bufs[channels];
      size_t offset = stream_.bufferSize * formatBytes( format );
      for ( int i=0; i<channels; i++ )
        bufs[i] = (void *) (buffer + (i * offset));
      result = snd_pcm_writen( handle[0], bufs, stream_.bufferSize );
    }

    if ( result < (int) stream_.bufferSize ) {
      // Either an error or underrun occurred.
      if ( result == -EPIPE ) {
        snd_pcm_state_t state = snd_pcm_state( handle[0] );
        if ( state == SND_PCM_STATE_XRUN ) {
          apiInfo->xrun[0] = true;
          result = snd_pcm_prepare( handle[0] );
          if ( result < 0 ) {
            errorStream_ << "RtApiAlsa::callbackEvent: error preparing device after underrun, " << snd_strerror( result ) << ".";
            errorText_ = errorStream_.str();
          }
          else
            errorText_ =  "RtApiAlsa::callbackEvent: audio write error, underrun.";
        }
        else {
          errorStream_ << "RtApiAlsa::callbackEvent: error, current state is " << snd_pcm_state_name( state ) << ", " << snd_strerror( result ) << ".";
          errorText_ = errorStream_.str();
        }
      }
      else {
        errorStream_ << "RtApiAlsa::callbackEvent: audio write error, " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
      }
      error( RTAUDIO_WARNING );
      goto unlock;
    }

    // Check stream latency
    result = snd_pcm_delay( handle[0], &frames );
    if ( result == 0 && frames > 0 ) stream_.latency[0] = frames;
  }

 unlock:
  MUTEX_UNLOCK( &stream_.mutex );

  RtApi::tickStreamTime();
  if ( doStopStream == 1 ) this->stopStream();
}